

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O1

void SortRootMove(int num_of_all_movements,Movement *all_movements)

{
  Movement *__last;
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  Movement *pMVar7;
  UINT8 UVar8;
  UINT8 UVar9;
  UINT8 UVar10;
  undefined1 uVar11;
  UINT32 UVar12;
  UINT8 UVar13;
  UINT8 UVar14;
  undefined2 uVar15;
  UINT8 UVar16;
  undefined2 uVar17;
  UINT8 UVar18;
  undefined1 uVar19;
  ulong uVar20;
  Movement *pMVar21;
  long lVar22;
  Movement *__i;
  Movement *pMVar23;
  Movement *pMVar24;
  size_t __n;
  
  if (0 < num_of_all_movements) {
    lVar22 = 0;
    do {
      if (*(uint *)((long)&all_movements->value + lVar22) < 0x7fffffe8) {
        *(UINT32 *)((long)&all_movements->value + lVar22) =
             HistoryTable[(&all_movements->from)[lVar22]][(&all_movements->to)[lVar22]];
      }
      lVar22 = lVar22 + 0xc;
    } while ((ulong)(uint)num_of_all_movements * 0xc != lVar22);
  }
  if (num_of_all_movements != 0) {
    uVar20 = (ulong)num_of_all_movements;
    __last = all_movements + uVar20;
    lVar22 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
              (all_movements,__last,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fda);
    if (num_of_all_movements < 0x11) {
      if (num_of_all_movements != 1) {
        pMVar23 = all_movements + 1;
        pMVar24 = all_movements;
        do {
          pMVar21 = pMVar23;
          uVar2 = pMVar21->value;
          if (all_movements->value < uVar2) {
            UVar13 = pMVar21->catc;
            UVar14 = pMVar21->movec;
            uVar15 = *(undefined2 *)&pMVar21->field_0xa;
            UVar8 = pMVar21->from;
            UVar9 = pMVar21->to;
            UVar10 = pMVar21->capture;
            uVar11 = pMVar21->field_0x3;
            UVar12 = pMVar21->value;
            memmove((void *)((long)pMVar24 + (0x18 - ((long)pMVar21 - (long)all_movements))),
                    all_movements,(long)pMVar21 - (long)all_movements);
            all_movements->from = UVar8;
            all_movements->to = UVar9;
            all_movements->capture = UVar10;
            all_movements->field_0x3 = uVar11;
            all_movements->value = UVar12;
            all_movements->catc = UVar13;
            all_movements->movec = UVar14;
            *(undefined2 *)&all_movements->field_0xa = uVar15;
          }
          else {
            UVar8 = pMVar24[1].from;
            UVar9 = pMVar24[1].to;
            UVar10 = pMVar24[1].capture;
            uVar11 = pMVar24[1].field_0x3;
            UVar13 = pMVar21->catc;
            UVar14 = pMVar21->movec;
            uVar15 = *(undefined2 *)&pMVar21->field_0xa;
            uVar1 = pMVar24->value;
            pMVar23 = pMVar21;
            while (uVar1 < uVar2) {
              UVar16 = pMVar23[-1].movec;
              uVar17 = *(undefined2 *)&pMVar23[-1].field_0xa;
              pMVar23->catc = pMVar23[-1].catc;
              pMVar23->movec = UVar16;
              *(undefined2 *)&pMVar23->field_0xa = uVar17;
              UVar16 = pMVar23[-1].to;
              UVar18 = pMVar23[-1].capture;
              uVar19 = pMVar23[-1].field_0x3;
              UVar12 = pMVar23[-1].value;
              pMVar23->from = pMVar23[-1].from;
              pMVar23->to = UVar16;
              pMVar23->capture = UVar18;
              pMVar23->field_0x3 = uVar19;
              pMVar23->value = UVar12;
              uVar1 = pMVar23[-2].value;
              pMVar23 = pMVar23 + -1;
            }
            pMVar23->from = UVar8;
            pMVar23->to = UVar9;
            pMVar23->capture = UVar10;
            pMVar23->field_0x3 = uVar11;
            pMVar23->value = uVar2;
            pMVar23->catc = UVar13;
            pMVar23->movec = UVar14;
            *(undefined2 *)&pMVar23->field_0xa = uVar15;
          }
          pMVar23 = pMVar21 + 1;
          pMVar24 = pMVar21;
        } while (pMVar21 + 1 != __last);
      }
    }
    else {
      pMVar23 = all_movements + 1;
      __n = 0xc;
      pMVar24 = all_movements;
      do {
        pMVar21 = (Movement *)(&all_movements->from + __n);
        uVar2 = *(uint *)((long)&all_movements->value + __n);
        if (all_movements->value < uVar2) {
          UVar13 = pMVar21->catc;
          UVar14 = pMVar21->movec;
          uVar15 = *(undefined2 *)&pMVar21->field_0xa;
          UVar8 = pMVar21->from;
          UVar9 = pMVar21->to;
          UVar10 = pMVar21->capture;
          uVar11 = pMVar21->field_0x3;
          UVar12 = pMVar21->value;
          memmove((void *)((long)pMVar24 + (0x18 - __n)),all_movements,__n);
          all_movements->from = UVar8;
          all_movements->to = UVar9;
          all_movements->capture = UVar10;
          all_movements->field_0x3 = uVar11;
          all_movements->value = UVar12;
          all_movements->catc = UVar13;
          all_movements->movec = UVar14;
          *(undefined2 *)&all_movements->field_0xa = uVar15;
        }
        else {
          UVar8 = pMVar21->from;
          UVar9 = pMVar21->to;
          UVar10 = pMVar21->capture;
          uVar11 = pMVar21->field_0x3;
          UVar13 = pMVar21->catc;
          UVar14 = pMVar21->movec;
          uVar15 = *(undefined2 *)&pMVar21->field_0xa;
          uVar1 = pMVar24->value;
          pMVar24 = pMVar21;
          pMVar7 = pMVar23;
          while (uVar1 < uVar2) {
            pMVar24 = pMVar7 + -1;
            UVar16 = pMVar7[-1].movec;
            uVar17 = *(undefined2 *)&pMVar7[-1].field_0xa;
            pMVar7->catc = pMVar7[-1].catc;
            pMVar7->movec = UVar16;
            *(undefined2 *)&pMVar7->field_0xa = uVar17;
            UVar16 = pMVar7[-1].to;
            UVar18 = pMVar7[-1].capture;
            uVar19 = pMVar7[-1].field_0x3;
            UVar12 = pMVar7[-1].value;
            pMVar7->from = pMVar7[-1].from;
            pMVar7->to = UVar16;
            pMVar7->capture = UVar18;
            pMVar7->field_0x3 = uVar19;
            pMVar7->value = UVar12;
            uVar1 = pMVar7[-2].value;
            pMVar7 = pMVar24;
          }
          pMVar24->from = UVar8;
          pMVar24->to = UVar9;
          pMVar24->capture = UVar10;
          pMVar24->field_0x3 = uVar11;
          pMVar24->value = uVar2;
          pMVar24->catc = UVar13;
          pMVar24->movec = UVar14;
          *(undefined2 *)&pMVar24->field_0xa = uVar15;
        }
        __n = __n + 0xc;
        pMVar23 = pMVar23 + 1;
        pMVar24 = pMVar21;
      } while (__n != 0xc0);
      pMVar23 = all_movements + 0x10;
      do {
        UVar8 = pMVar23->from;
        UVar9 = pMVar23->to;
        UVar10 = pMVar23->capture;
        uVar11 = pMVar23->field_0x3;
        uVar3 = pMVar23->value;
        uVar4 = pMVar23->catc;
        uVar5 = pMVar23->movec;
        uVar6 = *(undefined2 *)&pMVar23->field_0xa;
        uVar2 = pMVar23[-1].value;
        pMVar24 = pMVar23;
        while (uVar2 < (uint)uVar3) {
          UVar13 = pMVar24[-1].movec;
          uVar15 = *(undefined2 *)&pMVar24[-1].field_0xa;
          pMVar24->catc = pMVar24[-1].catc;
          pMVar24->movec = UVar13;
          *(undefined2 *)&pMVar24->field_0xa = uVar15;
          UVar13 = pMVar24[-1].to;
          UVar14 = pMVar24[-1].capture;
          uVar19 = pMVar24[-1].field_0x3;
          UVar12 = pMVar24[-1].value;
          pMVar24->from = pMVar24[-1].from;
          pMVar24->to = UVar13;
          pMVar24->capture = UVar14;
          pMVar24->field_0x3 = uVar19;
          pMVar24->value = UVar12;
          uVar2 = pMVar24[-2].value;
          pMVar24 = pMVar24 + -1;
        }
        pMVar24->from = UVar8;
        pMVar24->to = UVar9;
        pMVar24->capture = UVar10;
        pMVar24->field_0x3 = uVar11;
        pMVar24->value = uVar3;
        pMVar24->catc = uVar4;
        pMVar24->movec = uVar5;
        *(undefined2 *)&pMVar24->field_0xa = uVar6;
        pMVar23 = pMVar23 + 1;
      } while (pMVar23 != __last);
    }
  }
  return;
}

Assistant:

void SortRootMove(int num_of_all_movements, Movement* all_movements){
    // 对着法做历史表启发
    for(int i = 0; i < num_of_all_movements; i++){
        if(all_movements[i].value < MAX_MOVE_VALUE - 24){
            all_movements[i].value = HistoryTable[all_movements[i].from][all_movements[i].to];
        }
    }
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
}